

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O2

bool __thiscall road_network::are_twins(road_network *this,node_type n1,node_type n2)

{
  undefined7 in_register_00000031;
  bool bVar1;
  
  bVar1 = false;
  switch((int)CONCAT71(in_register_00000031,n1)) {
  case 2:
    bVar1 = n2 == P4;
    break;
  case 4:
    bVar1 = n2 == P5;
    break;
  case 6:
    bVar1 = n2 == P6;
    break;
  case 8:
    bVar1 = n2 == P7;
    break;
  case 10:
    bVar1 = n2 == P0;
    break;
  case 0xb:
    bVar1 = n2 == P1;
    break;
  case 0xc:
    bVar1 = n2 == P2;
    break;
  case 0xd:
    bVar1 = n2 == P3;
  }
  return bVar1;
}

Assistant:

bool road_network::are_twins(node_type n1, node_type n2)
{
    switch (n1)
    {
        case node_type::P0:
            return n2 == node_type::P4;
        case node_type::P1:
            return n2 == node_type::P5;
        case node_type::P2:
            return n2 == node_type::P6;
        case node_type::P3:
            return n2 == node_type::P7;
        case node_type::P4:
            return n2 == node_type::P0;
        case node_type::P5:
            return n2 == node_type::P1;
        case node_type::P6:
            return n2 == node_type::P2;
        case node_type::P7:
            return n2 == node_type::P3;
        default:
            return false;
    }
}